

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressorSimd.h
# Opt level: O0

void Imf_2_5::anon_unknown_9::dctForward8x8(float *data)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  float *pfVar21;
  undefined4 *in_RDI;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  __m128 c4NegVec;
  __m128 c4Vec;
  __m128 transTmp2 [4];
  __m128 transTmp [4];
  __m128 rotYVec;
  __m128 rotXVec;
  __m128 k1Vec;
  __m128 k0Vec;
  __m128 a7Vec;
  __m128 a6Vec;
  __m128 a5Vec;
  __m128 a4Vec;
  __m128 a3Vec;
  __m128 a2Vec;
  __m128 a1Vec;
  __m128 a0Vec;
  __m128 *srcVec;
  int local_770;
  int local_76c;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  int pass;
  int iter;
  __m128 halfVec;
  __m128 c7HalfVec;
  __m128 c6HalfVec;
  __m128 c5HalfVec;
  __m128 c3HalfVec;
  __m128 c2HalfVec;
  __m128 c1HalfVec;
  
  for (local_76c = 0; local_76c < 2; local_76c = local_76c + 1) {
    for (local_770 = 0; local_770 < 2; local_770 = local_770 + 1) {
      uVar17 = *(undefined8 *)(in_RDI + (long)local_770 * 4);
      uVar18 = *(undefined8 *)((long)(in_RDI + (long)local_770 * 4) + 8);
      uVar19 = *(undefined8 *)(in_RDI + (long)(local_770 + 0xe) * 4);
      uVar20 = *(undefined8 *)((long)(in_RDI + (long)(local_770 + 0xe) * 4) + 8);
      local_3f8 = (float)uVar17;
      fStack_3f4 = (float)((ulong)uVar17 >> 0x20);
      fStack_3f0 = (float)uVar18;
      fStack_3ec = (float)((ulong)uVar18 >> 0x20);
      local_408 = (float)uVar19;
      fStack_404 = (float)((ulong)uVar19 >> 0x20);
      fStack_400 = (float)uVar20;
      fStack_3fc = (float)((ulong)uVar20 >> 0x20);
      uVar17 = *(undefined8 *)(in_RDI + (long)(local_770 + 2) * 4);
      uVar18 = *(undefined8 *)((long)(in_RDI + (long)(local_770 + 2) * 4) + 8);
      uVar19 = *(undefined8 *)(in_RDI + (long)(local_770 + 4) * 4);
      uVar20 = *(undefined8 *)((long)(in_RDI + (long)(local_770 + 4) * 4) + 8);
      local_418 = (float)uVar17;
      fStack_414 = (float)((ulong)uVar17 >> 0x20);
      fStack_410 = (float)uVar18;
      fStack_40c = (float)((ulong)uVar18 >> 0x20);
      local_428 = (float)uVar19;
      fStack_424 = (float)((ulong)uVar19 >> 0x20);
      fStack_420 = (float)uVar20;
      fStack_41c = (float)((ulong)uVar20 >> 0x20);
      uVar17 = *(undefined8 *)(in_RDI + (long)(local_770 + 6) * 4);
      uVar18 = *(undefined8 *)((long)(in_RDI + (long)(local_770 + 6) * 4) + 8);
      uVar19 = *(undefined8 *)(in_RDI + (long)(local_770 + 8) * 4);
      uVar20 = *(undefined8 *)((long)(in_RDI + (long)(local_770 + 8) * 4) + 8);
      local_438 = (float)uVar17;
      fStack_434 = (float)((ulong)uVar17 >> 0x20);
      fStack_430 = (float)uVar18;
      fStack_42c = (float)((ulong)uVar18 >> 0x20);
      local_448 = (float)uVar19;
      fStack_444 = (float)((ulong)uVar19 >> 0x20);
      fStack_440 = (float)uVar20;
      fStack_43c = (float)((ulong)uVar20 >> 0x20);
      uVar17 = *(undefined8 *)(in_RDI + (long)(local_770 + 10) * 4);
      uVar18 = *(undefined8 *)((long)(in_RDI + (long)(local_770 + 10) * 4) + 8);
      uVar19 = *(undefined8 *)(in_RDI + (long)(local_770 + 0xc) * 4);
      uVar20 = *(undefined8 *)((long)(in_RDI + (long)(local_770 + 0xc) * 4) + 8);
      local_458 = (float)uVar17;
      fStack_454 = (float)((ulong)uVar17 >> 0x20);
      fStack_450 = (float)uVar18;
      fStack_44c = (float)((ulong)uVar18 >> 0x20);
      local_468 = (float)uVar19;
      fStack_464 = (float)((ulong)uVar19 >> 0x20);
      fStack_460 = (float)uVar20;
      fStack_45c = (float)((ulong)uVar20 >> 0x20);
      uVar17 = *(undefined8 *)(in_RDI + (long)local_770 * 4);
      uVar18 = *(undefined8 *)((long)(in_RDI + (long)local_770 * 4) + 8);
      uVar19 = *(undefined8 *)(in_RDI + (long)(local_770 + 0xe) * 4);
      uVar20 = *(undefined8 *)((long)(in_RDI + (long)(local_770 + 0xe) * 4) + 8);
      c2HalfVec[2] = (float)uVar17;
      c2HalfVec[3] = (float)((ulong)uVar17 >> 0x20);
      c1HalfVec[0] = (float)uVar18;
      c1HalfVec[1] = (float)((ulong)uVar18 >> 0x20);
      c3HalfVec[2] = (float)uVar19;
      c3HalfVec[3] = (float)((ulong)uVar19 >> 0x20);
      c2HalfVec[0] = (float)uVar20;
      c2HalfVec[1] = (float)((ulong)uVar20 >> 0x20);
      uVar17 = *(undefined8 *)(in_RDI + (long)(local_770 + 2) * 4);
      uVar18 = *(undefined8 *)((long)(in_RDI + (long)(local_770 + 2) * 4) + 8);
      uVar19 = *(undefined8 *)(in_RDI + (long)(local_770 + 4) * 4);
      uVar20 = *(undefined8 *)((long)(in_RDI + (long)(local_770 + 4) * 4) + 8);
      c5HalfVec[2] = (float)uVar17;
      c5HalfVec[3] = (float)((ulong)uVar17 >> 0x20);
      c3HalfVec[0] = (float)uVar18;
      c3HalfVec[1] = (float)((ulong)uVar18 >> 0x20);
      c6HalfVec[2] = (float)uVar19;
      c6HalfVec[3] = (float)((ulong)uVar19 >> 0x20);
      c5HalfVec[0] = (float)uVar20;
      c5HalfVec[1] = (float)((ulong)uVar20 >> 0x20);
      uVar17 = *(undefined8 *)(in_RDI + (long)(local_770 + 6) * 4);
      uVar18 = *(undefined8 *)((long)(in_RDI + (long)(local_770 + 6) * 4) + 8);
      uVar19 = *(undefined8 *)(in_RDI + (long)(local_770 + 8) * 4);
      uVar20 = *(undefined8 *)((long)(in_RDI + (long)(local_770 + 8) * 4) + 8);
      c7HalfVec[2] = (float)uVar17;
      c7HalfVec[3] = (float)((ulong)uVar17 >> 0x20);
      c6HalfVec[0] = (float)uVar18;
      c6HalfVec[1] = (float)((ulong)uVar18 >> 0x20);
      halfVec[2] = (float)uVar19;
      halfVec[3] = (float)((ulong)uVar19 >> 0x20);
      c7HalfVec[0] = (float)uVar20;
      c7HalfVec[1] = (float)((ulong)uVar20 >> 0x20);
      uVar17 = *(undefined8 *)(in_RDI + (long)(local_770 + 10) * 4);
      uVar18 = *(undefined8 *)((long)(in_RDI + (long)(local_770 + 10) * 4) + 8);
      uVar19 = *(undefined8 *)(in_RDI + (long)(local_770 + 0xc) * 4);
      uVar20 = *(undefined8 *)((long)(in_RDI + (long)(local_770 + 0xc) * 4) + 8);
      pass = (int)uVar17;
      iter = (int)((ulong)uVar17 >> 0x20);
      halfVec[0] = (float)uVar18;
      halfVec[1] = (float)((ulong)uVar18 >> 0x20);
      local_88 = (float)uVar19;
      fStack_84 = (float)((ulong)uVar19 >> 0x20);
      fStack_80 = (float)uVar20;
      fStack_7c = (float)((ulong)uVar20 >> 0x20);
      fVar22 = (local_3f8 + local_408 + local_438 + local_448) * 0.70710677;
      fVar24 = (fStack_3f4 + fStack_404 + fStack_434 + fStack_444) * 0.70710677;
      fVar26 = (fStack_3f0 + fStack_400 + fStack_430 + fStack_440) * 0.70710677;
      fVar32 = (fStack_3ec + fStack_3fc + fStack_42c + fStack_43c) * 0.70710677;
      fVar23 = (local_418 + local_428 + local_458 + local_468) * 0.70710677;
      fVar25 = (fStack_414 + fStack_424 + fStack_454 + fStack_464) * 0.70710677;
      fVar27 = (fStack_410 + fStack_420 + fStack_450 + fStack_460) * 0.70710677;
      fVar33 = (fStack_40c + fStack_41c + fStack_44c + fStack_45c) * 0.70710677;
      pfVar21 = (float *)(in_RDI + (long)local_770 * 4);
      *pfVar21 = fVar22 + fVar23;
      pfVar21[1] = fVar24 + fVar25;
      pfVar21[2] = fVar26 + fVar27;
      pfVar21[3] = fVar32 + fVar33;
      pfVar21 = (float *)(in_RDI + (long)(local_770 + 8) * 4);
      *pfVar21 = fVar22 - fVar23;
      pfVar21[1] = fVar24 - fVar25;
      pfVar21[2] = fVar26 - fVar27;
      pfVar21[3] = fVar32 - fVar33;
      uVar17 = *(undefined8 *)(in_RDI + (long)local_770 * 4);
      uVar18 = *(undefined8 *)((long)(in_RDI + (long)local_770 * 4) + 8);
      local_1f8 = (float)uVar17;
      fStack_1f4 = (float)((ulong)uVar17 >> 0x20);
      fStack_1f0 = (float)uVar18;
      fStack_1ec = (float)((ulong)uVar18 >> 0x20);
      pfVar21 = (float *)(in_RDI + (long)local_770 * 4);
      *pfVar21 = local_1f8 * 0.5;
      pfVar21[1] = fStack_1f4 * 0.5;
      pfVar21[2] = fStack_1f0 * 0.5;
      pfVar21[3] = fStack_1ec * 0.5;
      uVar17 = *(undefined8 *)(in_RDI + (long)(local_770 + 8) * 4);
      uVar18 = *(undefined8 *)((long)(in_RDI + (long)(local_770 + 8) * 4) + 8);
      local_218 = (float)uVar17;
      fStack_214 = (float)((ulong)uVar17 >> 0x20);
      fStack_210 = (float)uVar18;
      fStack_20c = (float)((ulong)uVar18 >> 0x20);
      pfVar21 = (float *)(in_RDI + (long)(local_770 + 8) * 4);
      *pfVar21 = local_218 * 0.5;
      pfVar21[1] = fStack_214 * 0.5;
      pfVar21[2] = fStack_210 * 0.5;
      pfVar21[3] = fStack_20c * 0.5;
      fVar22 = (c5HalfVec[2] - c6HalfVec[2]) - ((float)pass - local_88);
      fVar24 = (c5HalfVec[3] - c6HalfVec[3]) - ((float)iter - fStack_84);
      fVar26 = (c3HalfVec[0] - c5HalfVec[0]) - (halfVec[0] - fStack_80);
      fVar32 = (c3HalfVec[1] - c5HalfVec[1]) - (halfVec[1] - fStack_7c);
      fVar23 = (local_3f8 + local_408) - (local_438 + local_448);
      fVar25 = (fStack_3f4 + fStack_404) - (fStack_434 + fStack_444);
      fVar27 = (fStack_3f0 + fStack_400) - (fStack_430 + fStack_440);
      fVar33 = (fStack_3ec + fStack_3fc) - (fStack_42c + fStack_43c);
      pfVar21 = (float *)(in_RDI + (long)(local_770 + 4) * 4);
      *pfVar21 = fVar22 * 0.19134171 + fVar23 * 0.46193978;
      pfVar21[1] = fVar24 * 0.19134171 + fVar25 * 0.46193978;
      pfVar21[2] = fVar26 * 0.19134171 + fVar27 * 0.46193978;
      pfVar21[3] = fVar32 * 0.19134171 + fVar33 * 0.46193978;
      pfVar21 = (float *)(in_RDI + (long)(local_770 + 0xc) * 4);
      *pfVar21 = fVar23 * 0.19134171 - fVar22 * 0.46193978;
      pfVar21[1] = fVar25 * 0.19134171 - fVar24 * 0.46193978;
      pfVar21[2] = fVar27 * 0.19134171 - fVar26 * 0.46193978;
      pfVar21[3] = fVar33 * 0.19134171 - fVar32 * 0.46193978;
      fVar24 = ((local_418 + local_428) - (local_458 + local_468)) * 0.70710677;
      fVar32 = ((fStack_414 + fStack_424) - (fStack_454 + fStack_464)) * 0.70710677;
      fVar28 = ((fStack_410 + fStack_420) - (fStack_450 + fStack_460)) * 0.70710677;
      fVar34 = ((fStack_40c + fStack_41c) - (fStack_44c + fStack_45c)) * 0.70710677;
      fVar25 = ((c5HalfVec[2] - c6HalfVec[2]) + ((float)pass - local_88)) * -0.70710677;
      fVar33 = ((c5HalfVec[3] - c6HalfVec[3]) + ((float)iter - fStack_84)) * -0.70710677;
      fVar29 = ((c3HalfVec[0] - c5HalfVec[0]) + (halfVec[0] - fStack_80)) * -0.70710677;
      fVar35 = ((c3HalfVec[1] - c5HalfVec[1]) + (halfVec[1] - fStack_7c)) * -0.70710677;
      fVar22 = (c2HalfVec[2] - c3HalfVec[2]) - fVar24;
      fVar26 = (c2HalfVec[3] - c3HalfVec[3]) - fVar32;
      fVar30 = (c1HalfVec[0] - c2HalfVec[0]) - fVar28;
      fVar36 = (c1HalfVec[1] - c2HalfVec[1]) - fVar34;
      fVar23 = (c7HalfVec[2] - halfVec[2]) + fVar25;
      fVar27 = (c7HalfVec[3] - halfVec[3]) + fVar33;
      fVar31 = (c6HalfVec[0] - c7HalfVec[0]) + fVar29;
      fVar37 = (c6HalfVec[1] - c7HalfVec[1]) + fVar35;
      pfVar21 = (float *)(in_RDI + (long)(local_770 + 6) * 4);
      *pfVar21 = fVar22 * 0.4157348 - fVar23 * 0.27778512;
      pfVar21[1] = fVar26 * 0.4157348 - fVar27 * 0.27778512;
      pfVar21[2] = fVar30 * 0.4157348 - fVar31 * 0.27778512;
      pfVar21[3] = fVar36 * 0.4157348 - fVar37 * 0.27778512;
      pfVar21 = (float *)(in_RDI + (long)(local_770 + 10) * 4);
      *pfVar21 = fVar22 * 0.27778512 + fVar23 * 0.4157348;
      pfVar21[1] = fVar26 * 0.27778512 + fVar27 * 0.4157348;
      pfVar21[2] = fVar30 * 0.27778512 + fVar31 * 0.4157348;
      pfVar21[3] = fVar36 * 0.27778512 + fVar37 * 0.4157348;
      fVar24 = (c2HalfVec[2] - c3HalfVec[2]) + fVar24;
      fVar32 = (c2HalfVec[3] - c3HalfVec[3]) + fVar32;
      fVar28 = (c1HalfVec[0] - c2HalfVec[0]) + fVar28;
      fVar34 = (c1HalfVec[1] - c2HalfVec[1]) + fVar34;
      fVar25 = fVar25 - (c7HalfVec[2] - halfVec[2]);
      fVar33 = fVar33 - (c7HalfVec[3] - halfVec[3]);
      fVar29 = fVar29 - (c6HalfVec[0] - c7HalfVec[0]);
      fVar35 = fVar35 - (c6HalfVec[1] - c7HalfVec[1]);
      pfVar21 = (float *)(in_RDI + (long)(local_770 + 2) * 4);
      *pfVar21 = fVar24 * 0.49039263 - fVar25 * 0.09754516;
      pfVar21[1] = fVar32 * 0.49039263 - fVar33 * 0.09754516;
      pfVar21[2] = fVar28 * 0.49039263 - fVar29 * 0.09754516;
      pfVar21[3] = fVar34 * 0.49039263 - fVar35 * 0.09754516;
      pfVar21 = (float *)(in_RDI + (long)(local_770 + 0xe) * 4);
      *pfVar21 = fVar24 * 0.09754516 + fVar25 * 0.49039263;
      pfVar21[1] = fVar32 * 0.09754516 + fVar33 * 0.49039263;
      pfVar21[2] = fVar28 * 0.09754516 + fVar29 * 0.49039263;
      pfVar21[3] = fVar34 * 0.09754516 + fVar35 * 0.49039263;
    }
    uVar3 = in_RDI[1];
    uVar4 = in_RDI[0x11];
    uVar5 = in_RDI[0x13];
    uVar6 = in_RDI[2];
    uVar7 = in_RDI[3];
    uVar1 = in_RDI[0xb];
    uVar8 = in_RDI[0x25];
    uVar9 = in_RDI[0x35];
    uVar10 = in_RDI[0x26];
    uVar11 = in_RDI[0x27];
    uVar2 = in_RDI[0x2f];
    uVar12 = in_RDI[0x37];
    *in_RDI = *in_RDI;
    in_RDI[1] = in_RDI[8];
    in_RDI[2] = in_RDI[0x10];
    in_RDI[3] = in_RDI[0x18];
    in_RDI[0x10] = uVar6;
    in_RDI[0x11] = in_RDI[10];
    in_RDI[0x12] = in_RDI[0x12];
    in_RDI[0x13] = in_RDI[0x1a];
    in_RDI[8] = uVar3;
    in_RDI[9] = in_RDI[9];
    in_RDI[10] = uVar4;
    in_RDI[0xb] = in_RDI[0x19];
    in_RDI[0x18] = uVar7;
    in_RDI[0x19] = uVar1;
    in_RDI[0x1a] = uVar5;
    in_RDI[0x1b] = in_RDI[0x1b];
    in_RDI[0x24] = in_RDI[0x24];
    in_RDI[0x25] = in_RDI[0x2c];
    in_RDI[0x26] = in_RDI[0x34];
    in_RDI[0x27] = in_RDI[0x3c];
    in_RDI[0x34] = uVar10;
    in_RDI[0x35] = in_RDI[0x2e];
    in_RDI[0x36] = in_RDI[0x36];
    in_RDI[0x37] = in_RDI[0x3e];
    in_RDI[0x2c] = uVar8;
    in_RDI[0x2d] = in_RDI[0x2d];
    in_RDI[0x2e] = uVar9;
    in_RDI[0x2f] = in_RDI[0x3d];
    in_RDI[0x3c] = uVar11;
    in_RDI[0x3d] = uVar2;
    in_RDI[0x3e] = uVar12;
    in_RDI[0x3f] = in_RDI[0x3f];
    uVar9 = in_RDI[0x20];
    uVar10 = in_RDI[0x21];
    uVar1 = in_RDI[0x28];
    uVar2 = in_RDI[0x29];
    uVar11 = in_RDI[0x30];
    uVar12 = in_RDI[0x31];
    uVar3 = in_RDI[0x38];
    uVar4 = in_RDI[0x39];
    uVar13 = in_RDI[0x22];
    uVar14 = in_RDI[0x23];
    uVar5 = in_RDI[0x2a];
    uVar6 = in_RDI[0x2b];
    uVar15 = in_RDI[0x32];
    uVar16 = in_RDI[0x33];
    uVar7 = in_RDI[0x3a];
    uVar8 = in_RDI[0x3b];
    in_RDI[0x20] = in_RDI[4];
    in_RDI[0x21] = in_RDI[0xc];
    in_RDI[0x22] = in_RDI[0x14];
    in_RDI[0x23] = in_RDI[0x1c];
    in_RDI[0x30] = in_RDI[6];
    in_RDI[0x31] = in_RDI[0xe];
    in_RDI[0x32] = in_RDI[0x16];
    in_RDI[0x33] = in_RDI[0x1e];
    in_RDI[0x28] = in_RDI[5];
    in_RDI[0x29] = in_RDI[0xd];
    in_RDI[0x2a] = in_RDI[0x15];
    in_RDI[0x2b] = in_RDI[0x1d];
    in_RDI[0x38] = in_RDI[7];
    in_RDI[0x39] = in_RDI[0xf];
    in_RDI[0x3a] = in_RDI[0x17];
    in_RDI[0x3b] = in_RDI[0x1f];
    in_RDI[4] = uVar9;
    in_RDI[5] = uVar1;
    in_RDI[6] = uVar11;
    in_RDI[7] = uVar3;
    in_RDI[0x14] = uVar13;
    in_RDI[0x15] = uVar5;
    in_RDI[0x16] = uVar15;
    in_RDI[0x17] = uVar7;
    in_RDI[0xc] = uVar10;
    in_RDI[0xd] = uVar2;
    in_RDI[0xe] = uVar12;
    in_RDI[0xf] = uVar4;
    in_RDI[0x1c] = uVar14;
    in_RDI[0x1d] = uVar6;
    in_RDI[0x1e] = uVar16;
    in_RDI[0x1f] = uVar8;
  }
  return;
}

Assistant:

void 
dctForward8x8 (float *data)
{
    __m128 *srcVec = (__m128 *)data;
    __m128  a0Vec, a1Vec, a2Vec, a3Vec, a4Vec, a5Vec, a6Vec, a7Vec;
    __m128  k0Vec, k1Vec, rotXVec, rotYVec;
    __m128  transTmp[4], transTmp2[4];

    __m128  c4Vec     = { .70710678f,  .70710678f,  .70710678f,  .70710678f};
    __m128  c4NegVec  = {-.70710678f, -.70710678f, -.70710678f, -.70710678f};

    __m128  c1HalfVec = {.490392640f, .490392640f, .490392640f, .490392640f}; 
    __m128  c2HalfVec = {.461939770f, .461939770f, .461939770f, .461939770f};
    __m128  c3HalfVec = {.415734810f, .415734810f, .415734810f, .415734810f}; 
    __m128  c5HalfVec = {.277785120f, .277785120f, .277785120f, .277785120f}; 
    __m128  c6HalfVec = {.191341720f, .191341720f, .191341720f, .191341720f};
    __m128  c7HalfVec = {.097545161f, .097545161f, .097545161f, .097545161f}; 

    __m128  halfVec   = {.5f, .5f, .5f, .5f};

    for (int iter = 0; iter < 2; ++iter)
    {
        //
        //  Operate on 4 columns at a time. The
        //    offsets into our row-major array are:
        //                  0:  0      1
        //                  1:  2      3
        //                  2:  4      5
        //                  3:  6      7
        //                  4:  8      9
        //                  5: 10     11
        //                  6: 12     13
        //                  7: 14     15
        //

        for (int pass=0; pass<2; ++pass)
        {
            a0Vec = _mm_add_ps (srcVec[ 0 + pass], srcVec[14 + pass]);
            a1Vec = _mm_add_ps (srcVec[ 2 + pass], srcVec[ 4 + pass]);
            a3Vec = _mm_add_ps (srcVec[ 6 + pass], srcVec[ 8 + pass]);
            a5Vec = _mm_add_ps (srcVec[10 + pass], srcVec[12 + pass]);
 
            a7Vec = _mm_sub_ps (srcVec[ 0 + pass], srcVec[14 + pass]);
            a2Vec = _mm_sub_ps (srcVec[ 2 + pass], srcVec[ 4 + pass]);
            a4Vec = _mm_sub_ps (srcVec[ 6 + pass], srcVec[ 8 + pass]);
            a6Vec = _mm_sub_ps (srcVec[10 + pass], srcVec[12 + pass]);

            //
            // First stage; Compute out_0 and out_4
            //

            k0Vec = _mm_add_ps (a0Vec, a3Vec);
            k1Vec = _mm_add_ps (a1Vec, a5Vec);

            k0Vec = _mm_mul_ps (c4Vec, k0Vec);
            k1Vec = _mm_mul_ps (c4Vec, k1Vec);

            srcVec[0 + pass] = _mm_add_ps (k0Vec, k1Vec);
            srcVec[8 + pass] = _mm_sub_ps (k0Vec, k1Vec);

            srcVec[0 + pass] = _mm_mul_ps (srcVec[0 + pass], halfVec );
            srcVec[8 + pass] = _mm_mul_ps (srcVec[8 + pass], halfVec );


            //
            // Second stage; Compute out_2 and out_6
            //
            
            k0Vec = _mm_sub_ps (a2Vec, a6Vec);
            k1Vec = _mm_sub_ps (a0Vec, a3Vec);

            srcVec[ 4 + pass] = _mm_add_ps (_mm_mul_ps (c6HalfVec, k0Vec),
                                            _mm_mul_ps (c2HalfVec, k1Vec));

            srcVec[12 + pass] = _mm_sub_ps (_mm_mul_ps (c6HalfVec, k1Vec), 
                                            _mm_mul_ps (c2HalfVec, k0Vec));

            //
            // Precompute K0 and K1 for the remaining stages
            //

            k0Vec = _mm_mul_ps (_mm_sub_ps (a1Vec, a5Vec), c4Vec);
            k1Vec = _mm_mul_ps (_mm_add_ps (a2Vec, a6Vec), c4NegVec); 

            //
            // Third Stage, compute out_3 and out_5
            //

            rotXVec = _mm_sub_ps (a7Vec, k0Vec);
            rotYVec = _mm_add_ps (a4Vec, k1Vec);

            srcVec[ 6 + pass] = _mm_sub_ps (_mm_mul_ps (c3HalfVec, rotXVec),
                                            _mm_mul_ps (c5HalfVec, rotYVec));

            srcVec[10 + pass] = _mm_add_ps (_mm_mul_ps (c5HalfVec, rotXVec),
                                            _mm_mul_ps (c3HalfVec, rotYVec));

            //
            // Fourth Stage, compute out_1 and out_7
            //

            rotXVec = _mm_add_ps (a7Vec, k0Vec);
            rotYVec = _mm_sub_ps (k1Vec, a4Vec);

            srcVec[ 2 + pass] = _mm_sub_ps (_mm_mul_ps (c1HalfVec, rotXVec),
                                            _mm_mul_ps (c7HalfVec, rotYVec));

            srcVec[14 + pass] = _mm_add_ps (_mm_mul_ps (c7HalfVec, rotXVec), 
                                            _mm_mul_ps (c1HalfVec, rotYVec));
        }

        //
        // Transpose the matrix, in 4x4 blocks. So, if we have our
        // 8x8 matrix divied into 4x4 blocks:
        //
        //         M0 | M1         M0t | M2t
        //        ----+---   -->  -----+------
        //         M2 | M3         M1t | M3t
        //

        //
        // M0t, done in place, the first half.
        //

        transTmp[0] = _mm_shuffle_ps (srcVec[0], srcVec[2], 0x44);
        transTmp[1] = _mm_shuffle_ps (srcVec[4], srcVec[6], 0x44);
        transTmp[3] = _mm_shuffle_ps (srcVec[4], srcVec[6], 0xEE);
        transTmp[2] = _mm_shuffle_ps (srcVec[0], srcVec[2], 0xEE);

        //
        // M3t, also done in place, the first half.
        //

        transTmp2[0] = _mm_shuffle_ps (srcVec[ 9], srcVec[11], 0x44);
        transTmp2[1] = _mm_shuffle_ps (srcVec[13], srcVec[15], 0x44);
        transTmp2[2] = _mm_shuffle_ps (srcVec[ 9], srcVec[11], 0xEE);
        transTmp2[3] = _mm_shuffle_ps (srcVec[13], srcVec[15], 0xEE);

        //
        // M0t, the second half.
        //

        srcVec[0] = _mm_shuffle_ps (transTmp[0], transTmp[1], 0x88);
        srcVec[4] = _mm_shuffle_ps (transTmp[2], transTmp[3], 0x88);
        srcVec[2] = _mm_shuffle_ps (transTmp[0], transTmp[1], 0xDD);
        srcVec[6] = _mm_shuffle_ps (transTmp[2], transTmp[3], 0xDD);

        //
        // M3t, the second half.
        //

        srcVec[ 9] = _mm_shuffle_ps (transTmp2[0], transTmp2[1], 0x88);
        srcVec[13] = _mm_shuffle_ps (transTmp2[2], transTmp2[3], 0x88);
        srcVec[11] = _mm_shuffle_ps (transTmp2[0], transTmp2[1], 0xDD);
        srcVec[15] = _mm_shuffle_ps (transTmp2[2], transTmp2[3], 0xDD);

        //
        // M1 and M2 need to be done at the same time, because we're
        //  swapping. 
        //
        // First, the first half of M1t
        //

        transTmp[0] = _mm_shuffle_ps (srcVec[1], srcVec[3], 0x44);
        transTmp[1] = _mm_shuffle_ps (srcVec[5], srcVec[7], 0x44);
        transTmp[2] = _mm_shuffle_ps (srcVec[1], srcVec[3], 0xEE);
        transTmp[3] = _mm_shuffle_ps (srcVec[5], srcVec[7], 0xEE);

        //
        // And the first half of M2t
        //

        transTmp2[0] = _mm_shuffle_ps (srcVec[ 8], srcVec[10], 0x44);
        transTmp2[1] = _mm_shuffle_ps (srcVec[12], srcVec[14], 0x44);
        transTmp2[2] = _mm_shuffle_ps (srcVec[ 8], srcVec[10], 0xEE);
        transTmp2[3] = _mm_shuffle_ps (srcVec[12], srcVec[14], 0xEE);

        //
        // Second half of M1t
        //

        srcVec[ 8] = _mm_shuffle_ps (transTmp[0], transTmp[1], 0x88);
        srcVec[12] = _mm_shuffle_ps (transTmp[2], transTmp[3], 0x88);
        srcVec[10] = _mm_shuffle_ps (transTmp[0], transTmp[1], 0xDD);
        srcVec[14] = _mm_shuffle_ps (transTmp[2], transTmp[3], 0xDD);

        //
        // Second half of M2
        //

        srcVec[1] = _mm_shuffle_ps (transTmp2[0], transTmp2[1], 0x88);
        srcVec[5] = _mm_shuffle_ps (transTmp2[2], transTmp2[3], 0x88);
        srcVec[3] = _mm_shuffle_ps (transTmp2[0], transTmp2[1], 0xDD);
        srcVec[7] = _mm_shuffle_ps (transTmp2[2], transTmp2[3], 0xDD);
    }
}